

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecsBase.hpp
# Opt level: O3

void __thiscall sciplot::GridSpecsBase::repr_abi_cxx11_(GridSpecsBase *this)

{
  long in_RSI;
  
  repr_abi_cxx11_((string *)this,(GridSpecsBase *)(in_RSI + -0xd0));
  return;
}

Assistant:

inline auto GridSpecsBase::repr() const -> std::string
{
    const auto show = ShowSpecsOf<GridSpecsBase>::repr();
    const auto visible = show != "no";

    if(m_tics.empty() && !visible)
        return "unset grid";

    if(m_tics.size() && !visible)
        return "set grid no" + m_tics;

    std::stringstream ss;
    ss << "set grid " << m_tics << " ";
    ss << DepthSpecsOf<GridSpecsBase>::repr() << " ";
    if(m_majortics)
        ss << LineSpecsOf<GridSpecsBase>::repr();
    else
        ss << ", " + LineSpecsOf<GridSpecsBase>::repr(); // For minor tics, the preceding comma is needed
    return internal::removeExtraWhitespaces(ss.str());
}